

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall
HEkk::choosePriceTechnique
          (HEkk *this,HighsInt price_strategy,double row_ep_density,bool *use_col_price,
          bool *use_row_price_w_switch)

{
  *use_col_price = 0.75 < row_ep_density && price_strategy == 3 || price_strategy == 0;
  *use_row_price_w_switch = (price_strategy & 0xfffffffeU) == 2;
  return;
}

Assistant:

void HEkk::choosePriceTechnique(const HighsInt price_strategy,
                                const double row_ep_density,
                                bool& use_col_price,
                                bool& use_row_price_w_switch) {
  // By default switch to column PRICE when pi_p has at least this
  // density
  const double density_for_column_price_switch = 0.75;
  use_col_price = (price_strategy == kSimplexPriceStrategyCol) ||
                  (price_strategy == kSimplexPriceStrategyRowSwitchColSwitch &&
                   row_ep_density > density_for_column_price_switch);
  use_row_price_w_switch =
      price_strategy == kSimplexPriceStrategyRowSwitch ||
      price_strategy == kSimplexPriceStrategyRowSwitchColSwitch;
}